

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void do_dup(TCGContext_conflict9 *tcg_ctx,uint vece,uint32_t dofs,uint32_t oprsz,uint32_t maxsz,
           TCGv_i32 in_32,TCGv_i64 in_64,uint64_t in_c)

{
  _Bool _Var1;
  TCGType_conflict type_00;
  uint32_t val;
  TCGv_vec r;
  TCGv_ptr r_00;
  TCGv_i32 arg2;
  TCGv_i64 arg3;
  TCGv_i32 ret;
  uint uVar2;
  bool local_81;
  _Bool local_69;
  TCGv_vec t_vec;
  uint32_t i;
  TCGv_ptr t_ptr;
  TCGv_i32 t_desc;
  TCGv_i32 t_32;
  TCGv_i64 t_64;
  TCGType_conflict type;
  TCGv_i32 in_32_local;
  uint32_t maxsz_local;
  uint32_t oprsz_local;
  uint32_t dofs_local;
  uint vece_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  uVar2 = 3;
  if (in_32 != (TCGv_i32)0x0) {
    uVar2 = 2;
  }
  if (uVar2 < vece) {
    __assert_fail("vece <= (in_32 ? MO_32 : MO_64)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                  ,0x1e1,
                  "void do_dup(TCGContext *, unsigned int, uint32_t, uint32_t, uint32_t, TCGv_i32, TCGv_i64, uint64_t)"
                 );
  }
  if ((in_32 != (TCGv_i32)0x0) && (in_64 != (TCGv_i64)0x0)) {
    __assert_fail("in_32 == NULL || in_64 == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                  ,0x1e2,
                  "void do_dup(TCGContext *, unsigned int, uint32_t, uint32_t, uint32_t, TCGv_i32, TCGv_i64, uint64_t)"
                 );
  }
  in_32_local._4_4_ = oprsz;
  if (((in_32 == (TCGv_i32)0x0) && (in_64 == (TCGv_i64)0x0)) &&
     (in_c = dup_const_func_tricore(vece,in_c), in_c == 0)) {
    in_32_local._4_4_ = maxsz;
  }
  local_69 = false;
  if (in_32 == (TCGv_i32)0x0) {
    local_81 = in_64 == (TCGv_i64)0x0 || vece == 3;
    local_69 = local_81;
  }
  type_00 = choose_vector_type(tcg_ctx,(TCGOpcode *)0x0,vece,in_32_local._4_4_,local_69);
  if (type_00 != TCG_TYPE_I32) {
    r = tcg_temp_new_vec_tricore(tcg_ctx,type_00);
    if (in_32 == (TCGv_i32)0x0) {
      if (in_64 == (TCGv_i64)0x0) {
        tcg_gen_dupi_vec_tricore(tcg_ctx,vece,r,in_c);
      }
      else {
        tcg_gen_dup_i64_vec_tricore(tcg_ctx,vece,r,in_64);
      }
    }
    else {
      tcg_gen_dup_i32_vec_tricore(tcg_ctx,vece,r,in_32);
    }
    do_dup_store(tcg_ctx,type_00,dofs,in_32_local._4_4_,maxsz,r);
    tcg_temp_free_vec(tcg_ctx,r);
    return;
  }
  _Var1 = check_size_impl(in_32_local._4_4_,8);
  uVar2 = (uint)in_c;
  if (_Var1) {
    t_32 = (TCGv_i32)0x0;
    t_desc = (TCGv_i32)0x0;
    if (in_32 == (TCGv_i32)0x0) {
      if (in_64 == (TCGv_i64)0x0) {
        if (((vece == 3) || (in_c == 0)) ||
           ((in_c == 0xffffffffffffffff || (_Var1 = check_size_impl(in_32_local._4_4_,4), !_Var1))))
        {
          t_32 = (TCGv_i32)tcg_const_i64_tricore(tcg_ctx,in_c);
        }
        else {
          t_desc = tcg_const_i32_tricore(tcg_ctx,uVar2);
        }
      }
      else {
        t_32 = (TCGv_i32)tcg_temp_new_i64(tcg_ctx);
        gen_dup_i64(tcg_ctx,vece,(TCGv_i64)t_32,in_64);
      }
    }
    else if ((vece == 2) && (_Var1 = check_size_impl(in_32_local._4_4_,4), _Var1)) {
      t_desc = tcg_temp_new_i32(tcg_ctx);
      gen_dup_i32(tcg_ctx,2,t_desc,in_32);
    }
    else {
      t_32 = (TCGv_i32)tcg_temp_new_i64(tcg_ctx);
      tcg_gen_extu_i32_i64_tricore(tcg_ctx,(TCGv_i64)t_32,in_32);
      gen_dup_i64(tcg_ctx,vece,(TCGv_i64)t_32,(TCGv_i64)t_32);
    }
    if (t_desc == (TCGv_i32)0x0) {
      if (t_32 == (TCGv_i32)0x0) goto LAB_013483ee;
      for (t_vec._4_4_ = 0; t_vec._4_4_ < in_32_local._4_4_; t_vec._4_4_ = t_vec._4_4_ + 8) {
        tcg_gen_st_i64_tricore(tcg_ctx,(TCGv_i64)t_32,tcg_ctx->cpu_env,(ulong)(dofs + t_vec._4_4_));
      }
      tcg_temp_free_i64(tcg_ctx,(TCGv_i64)t_32);
    }
    else {
      for (t_vec._4_4_ = 0; t_vec._4_4_ < in_32_local._4_4_; t_vec._4_4_ = t_vec._4_4_ + 4) {
        tcg_gen_st_i32(tcg_ctx,t_desc,tcg_ctx->cpu_env,(ulong)(dofs + t_vec._4_4_));
      }
      tcg_temp_free_i32(tcg_ctx,t_desc);
    }
    if (in_32_local._4_4_ < maxsz) {
      expand_clr(tcg_ctx,dofs + in_32_local._4_4_,maxsz - in_32_local._4_4_);
    }
  }
  else {
LAB_013483ee:
    r_00 = tcg_temp_new_ptr(tcg_ctx);
    tcg_gen_addi_ptr(tcg_ctx,r_00,tcg_ctx->cpu_env,(ulong)dofs);
    val = simd_desc_tricore(in_32_local._4_4_,maxsz,0);
    arg2 = tcg_const_i32_tricore(tcg_ctx,val);
    if (vece == 3) {
      if (in_64 == (TCGv_i64)0x0) {
        arg3 = tcg_const_i64_tricore(tcg_ctx,in_c);
        gen_helper_gvec_dup64(tcg_ctx,r_00,arg2,arg3);
        tcg_temp_free_i64(tcg_ctx,arg3);
      }
      else {
        gen_helper_gvec_dup64(tcg_ctx,r_00,arg2,in_64);
      }
    }
    else if (in_32 == (TCGv_i32)0x0) {
      ret = tcg_temp_new_i32(tcg_ctx);
      if (in_64 == (TCGv_i64)0x0) {
        if (vece == 0) {
          tcg_gen_movi_i32(tcg_ctx,ret,uVar2 & 0xff);
        }
        else if (vece == 1) {
          tcg_gen_movi_i32(tcg_ctx,ret,uVar2 & 0xffff);
        }
        else {
          tcg_gen_movi_i32(tcg_ctx,ret,uVar2);
        }
      }
      else {
        tcg_gen_extrl_i64_i32_tricore(tcg_ctx,ret,in_64);
      }
      (*do_dup::fns[vece])(tcg_ctx,r_00,arg2,ret);
      tcg_temp_free_i32(tcg_ctx,ret);
    }
    else {
      (*do_dup::fns[vece])(tcg_ctx,r_00,arg2,in_32);
    }
    tcg_temp_free_ptr(tcg_ctx,r_00);
    tcg_temp_free_i32(tcg_ctx,arg2);
  }
  return;
}

Assistant:

static void do_dup(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t oprsz,
                   uint32_t maxsz, TCGv_i32 in_32, TCGv_i64 in_64,
                   uint64_t in_c)
{
    TCGType type;
    TCGv_i64 t_64;
    TCGv_i32 t_32, t_desc;
    TCGv_ptr t_ptr;
    uint32_t i;

    assert(vece <= (in_32 ? MO_32 : MO_64));
    assert(in_32 == NULL || in_64 == NULL);

    /* If we're storing 0, expand oprsz to maxsz.  */
    if (in_32 == NULL && in_64 == NULL) {
        in_c = dup_const(vece, in_c);
        if (in_c == 0) {
            oprsz = maxsz;
        }
    }

    /* Implement inline with a vector type, if possible.
     * Prefer integer when 64-bit host and no variable dup.
     */
    type = choose_vector_type(tcg_ctx, NULL, vece, oprsz,
                              (TCG_TARGET_REG_BITS == 64 && in_32 == NULL
                               && (in_64 == NULL || vece == MO_64)));
    if (type != 0) {
        TCGv_vec t_vec = tcg_temp_new_vec(tcg_ctx, type);

        if (in_32) {
            tcg_gen_dup_i32_vec(tcg_ctx, vece, t_vec, in_32);
        } else if (in_64) {
            tcg_gen_dup_i64_vec(tcg_ctx, vece, t_vec, in_64);
        } else {
            tcg_gen_dupi_vec(tcg_ctx, vece, t_vec, in_c);
        }
        do_dup_store(tcg_ctx, type, dofs, oprsz, maxsz, t_vec);
        tcg_temp_free_vec(tcg_ctx, t_vec);
        return;
    }

    /* Otherwise, inline with an integer type, unless "large".  */
    if (check_size_impl(oprsz, TCG_TARGET_REG_BITS / 8)) {
        t_64 = NULL;
        t_32 = NULL;

        if (in_32) {
            /* We are given a 32-bit variable input.  For a 64-bit host,
               use a 64-bit operation unless the 32-bit operation would
               be simple enough.  */
            if (TCG_TARGET_REG_BITS == 64
                && (vece != MO_32 || !check_size_impl(oprsz, 4))) {
                t_64 = tcg_temp_new_i64(tcg_ctx);
                tcg_gen_extu_i32_i64(tcg_ctx, t_64, in_32);
                gen_dup_i64(tcg_ctx, vece, t_64, t_64);
            } else {
                t_32 = tcg_temp_new_i32(tcg_ctx);
                gen_dup_i32(tcg_ctx, vece, t_32, in_32);
            }
        } else if (in_64) {
            /* We are given a 64-bit variable input.  */
            t_64 = tcg_temp_new_i64(tcg_ctx);
            gen_dup_i64(tcg_ctx, vece, t_64, in_64);
        } else {
            /* We are given a constant input.  */
            /* For 64-bit hosts, use 64-bit constants for "simple" constants
               or when we'd need too many 32-bit stores, or when a 64-bit
               constant is really required.  */
            if (vece == MO_64
                || (TCG_TARGET_REG_BITS == 64
                    && (in_c == 0 || in_c == -1
                        || !check_size_impl(oprsz, 4)))) {
                t_64 = tcg_const_i64(tcg_ctx, in_c);
            } else {
                t_32 = tcg_const_i32(tcg_ctx, in_c);
            }
        }

        /* Implement inline if we picked an implementation size above.  */
        if (t_32) {
            for (i = 0; i < oprsz; i += 4) {
                tcg_gen_st_i32(tcg_ctx, t_32, tcg_ctx->cpu_env, dofs + i);
            }
            tcg_temp_free_i32(tcg_ctx, t_32);
            goto done;
        }
        if (t_64) {
            for (i = 0; i < oprsz; i += 8) {
                tcg_gen_st_i64(tcg_ctx, t_64, tcg_ctx->cpu_env, dofs + i);
            }
            tcg_temp_free_i64(tcg_ctx, t_64);
            goto done;
        }
    }

    /* Otherwise implement out of line.  */
    t_ptr = tcg_temp_new_ptr(tcg_ctx);
    tcg_gen_addi_ptr(tcg_ctx, t_ptr, tcg_ctx->cpu_env, dofs);
    t_desc = tcg_const_i32(tcg_ctx, simd_desc(oprsz, maxsz, 0));

    if (vece == MO_64) {
        if (in_64) {
            gen_helper_gvec_dup64(tcg_ctx, t_ptr, t_desc, in_64);
        } else {
            t_64 = tcg_const_i64(tcg_ctx, in_c);
            gen_helper_gvec_dup64(tcg_ctx, t_ptr, t_desc, t_64);
            tcg_temp_free_i64(tcg_ctx, t_64);
        }
    } else {
        typedef void dup_fn(TCGContext *, TCGv_ptr, TCGv_i32, TCGv_i32);
        static dup_fn * const fns[3] = {
            gen_helper_gvec_dup8,
            gen_helper_gvec_dup16,
            gen_helper_gvec_dup32
        };

        if (in_32) {
            fns[vece](tcg_ctx, t_ptr, t_desc, in_32);
        } else {
            t_32 = tcg_temp_new_i32(tcg_ctx);
            if (in_64) {
                tcg_gen_extrl_i64_i32(tcg_ctx, t_32, in_64);
            } else if (vece == MO_8) {
                tcg_gen_movi_i32(tcg_ctx, t_32, in_c & 0xff);
            } else if (vece == MO_16) {
                tcg_gen_movi_i32(tcg_ctx, t_32, in_c & 0xffff);
            } else {
                tcg_gen_movi_i32(tcg_ctx, t_32, in_c);
            }
            fns[vece](tcg_ctx, t_ptr, t_desc, t_32);
            tcg_temp_free_i32(tcg_ctx, t_32);
        }
    }

    tcg_temp_free_ptr(tcg_ctx, t_ptr);
    tcg_temp_free_i32(tcg_ctx, t_desc);
    return;

 done:
    if (oprsz < maxsz) {
        expand_clr(tcg_ctx, dofs + oprsz, maxsz - oprsz);
    }
}